

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestOneof2_FooGroup::Clear(TestOneof2_FooGroup *this)

{
  if ((undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x1) !=
      (undefined1  [24])0x0) {
    google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.b_);
  }
  (this->field_0)._impl_.a_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneof2_FooGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestOneof2.FooGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.b_.ClearNonDefaultToEmpty();
  }
  _impl_.a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}